

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cc
# Opt level: O1

char * __thiscall dtc::__xpg_basename(dtc *this,char *__path)

{
  function<char_*(char_*)> local_28;
  
  local_28.super__Function_base._M_functor._8_8_ = 0;
  local_28.super__Function_base._M_functor._M_unused._M_function_pointer = ::__xpg_basename;
  local_28._M_invoker =
       std::_Function_handler<char_*(char_*),_char_*(*)(char_*)_noexcept>::_M_invoke;
  local_28.super__Function_base._M_manager =
       std::_Function_handler<char_*(char_*),_char_*(*)(char_*)_noexcept>::_M_manager;
  anon_unknown_3::dirbasename((string *)this,&local_28,(string *)__path);
  if (local_28.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_28.super__Function_base._M_manager)
              ((_Any_data *)&local_28,(_Any_data *)&local_28,__destroy_functor);
  }
  return (char *)this;
}

Assistant:

string basename(const string &s)
{
	return dirbasename(::basename, s);
}